

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O1

void wabt::cat_concatenate<std::__cxx11::string,std::__cxx11::string,char[4]>
               (string *s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [4])

{
  std::__cxx11::string::_M_append((char *)s,(ulong)(t->_M_dataplus)._M_p);
  std::__cxx11::string::_M_append((char *)s,(ulong)(args->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void cat_concatenate(std::string& s, const T& t, const Ts&... args) {
  s += t;
  cat_concatenate(s, args...);
}